

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stresstest.c
# Opt level: O1

int verify(EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  size_t sVar4;
  uint uVar5;
  bool bVar6;
  
  uVar5 = (uint)sig;
  bVar6 = uVar5 < 2;
  if (!bVar6) {
    uVar3 = *(ulong *)ctx;
    uVar2 = 1;
    if ((long)uVar3 <= *(long *)(ctx + 8)) {
      uVar3 = (ulong)(uVar5 - 2);
      sVar4 = 0;
      do {
        if (uVar5 - 2 == (uint)sVar4) {
          bVar6 = true;
          goto LAB_001139b1;
        }
        tbslen = *(size_t *)(ctx + sVar4 * 8 + 8);
        siglen = sVar4 + 1;
        lVar1 = sVar4 * 8;
        sVar4 = siglen;
      } while ((long)tbslen <= *(long *)(ctx + lVar1 + 0x10));
      uVar2 = (int)siglen + 1;
      bVar6 = uVar5 <= uVar2;
    }
    printf("Verify failed! at %d",(ulong)uVar2,siglen,uVar3,tbslen);
  }
LAB_001139b1:
  return (int)bVar6;
}

Assistant:

int verify(int64_t *dst, const unsigned size) {
  for (unsigned i = 1; i < size; i++) {
    if (dst[i - 1] > dst[i]) {
      printf("Verify failed! at %d", i);
      return 0;
    }
  }
  return 1;
}